

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_resize(REF_INTERP ref_interp,REF_INT max)

{
  REF_BOOL *__ptr;
  REF_INT *pRVar1;
  REF_DBL *__ptr_00;
  undefined8 uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  uVar5 = (ulong)(uint)max;
  uVar4 = ref_interp->max;
  fflush(_stdout);
  __ptr = ref_interp->agent_hired;
  if (0 < max) {
    __ptr = (REF_BOOL *)realloc(__ptr,uVar5 * 4);
    ref_interp->agent_hired = __ptr;
  }
  if (__ptr == (REF_BOOL *)0x0) {
    pcVar6 = "realloc ref_interp->agent_hired NULL";
    uVar2 = 0xd1;
  }
  else {
    if ((int)uVar4 < max) {
      memset(__ptr + (int)uVar4,0,(ulong)(~uVar4 + max) * 4 + 4);
    }
    fflush(_stdout);
    pRVar1 = ref_interp->cell;
    if (0 < max) {
      pRVar1 = (REF_INT *)realloc(pRVar1,uVar5 * 4);
      ref_interp->cell = pRVar1;
    }
    if (pRVar1 == (REF_INT *)0x0) {
      pcVar6 = "realloc ref_interp->cell NULL";
      uVar2 = 0xd2;
    }
    else {
      if ((int)uVar4 < max) {
        memset(pRVar1 + (int)uVar4,0xff,(ulong)(~uVar4 + max) * 4 + 4);
      }
      fflush(_stdout);
      pRVar1 = ref_interp->part;
      if (0 < max) {
        pRVar1 = (REF_INT *)realloc(pRVar1,uVar5 << 2);
        ref_interp->part = pRVar1;
      }
      if (pRVar1 != (REF_INT *)0x0) {
        if ((int)uVar4 < max) {
          memset(pRVar1 + (int)uVar4,0xff,(ulong)(~uVar4 + max) * 4 + 4);
        }
        fflush(_stdout);
        uVar4 = max * 4;
        __ptr_00 = ref_interp->bary;
        if (0 < max) {
          __ptr_00 = (REF_DBL *)realloc(__ptr_00,(ulong)uVar4 << 3);
          ref_interp->bary = __ptr_00;
        }
        if (__ptr_00 != (REF_DBL *)0x0) {
          ref_interp->max = max;
          return 0;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xd4,"ref_interp_resize","realloc ref_interp->bary NULL");
        lVar3 = (long)(int)uVar4;
        lVar7 = lVar3 * 8;
        uVar2 = 8;
        uVar5 = (ulong)uVar4;
        goto LAB_00157d5b;
      }
      pcVar6 = "realloc ref_interp->part NULL";
      uVar2 = 0xd3;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar2,
         "ref_interp_resize",pcVar6);
  lVar3 = (long)max;
  lVar7 = lVar3 * 4;
  uVar2 = 4;
LAB_00157d5b:
  printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar5,lVar3,uVar2,lVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_resize(REF_INTERP ref_interp, REF_INT max) {
  REF_INT old = ref_interp_max(ref_interp);

  ref_realloc_init(ref_interp->agent_hired, old, max, REF_BOOL, REF_FALSE);
  ref_realloc_init(ref_interp->cell, old, max, REF_INT, REF_EMPTY);
  ref_realloc_init(ref_interp->part, old, max, REF_INT, REF_EMPTY);
  ref_realloc(ref_interp->bary, 4 * max, REF_DBL);

  ref_interp_max(ref_interp) = max;

  return REF_SUCCESS;
}